

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_244201::ValueSetter::handleEOF(ValueSetter *this)

{
  size_t in_RCX;
  void *__buf;
  allocator<char> local_31;
  string local_30 [32];
  
  if (this->replaced == false) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"/Tx BMC\n",&local_31);
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)local_30,__buf,in_RCX);
    std::__cxx11::string::~string(local_30);
    writeAppearance(this);
  }
  return;
}

Assistant:

void
ValueSetter::handleEOF()
{
    if (!this->replaced) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper replaced BMC at EOF");
        write("/Tx BMC\n");
        writeAppearance();
    }
}